

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackDebGenerator::PackageComponentsAllInOne(cmCPackDebGenerator *this,string *compInstDirName)

{
  pointer pcVar1;
  pointer pcVar2;
  cmCPackLog *pcVar3;
  size_t sVar4;
  bool bVar5;
  string *psVar6;
  size_t sVar7;
  uint uVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string outputFileName;
  string localToplevel;
  string initialTopLevel;
  string packageFileName;
  string component_path;
  ostringstream cmCPackLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  long *local_258 [2];
  long local_248 [2];
  long *local_238;
  long local_230;
  long local_228 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_218;
  size_type local_200;
  pointer local_1f8;
  undefined8 local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [24];
  char local_190 [88];
  ios_base local_138 [264];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->super_cmCPackGenerator).packageFileNames,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_DIRECTORY","");
  psVar6 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
  if (psVar6 == (string *)0x0) {
    psVar6 = &cmValue::Empty_abi_cxx11_;
  }
  local_238 = local_228;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar2,pcVar2 + psVar6->_M_string_length);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
             ,0x5b);
  std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar3 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  sVar4 = local_218.first._M_len;
  sVar7 = strlen((char *)local_218.first._M_len);
  cmCPackLog::Log(pcVar3,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x26e,(char *)sVar4,sVar7);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_218.first._M_len
      != &local_218.second) {
    operator_delete((void *)local_218.first._M_len,
                    (ulong)((long)&((local_218.second)->_M_dataplus)._M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,local_238,local_230 + (long)local_238);
  cmsys::SystemTools::GetParentDirectory(&local_1e8,&(this->super_cmCPackGenerator).toplevel);
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_PACKAGE_FILE_NAME","");
  psVar6 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  if (psVar6 == (string *)0x0) {
    psVar6 = &cmValue::Empty_abi_cxx11_;
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar2,pcVar2 + psVar6->_M_string_length);
  std::__cxx11::string::append((char *)&local_278);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  if (compInstDirName->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "/",compInstDirName);
    std::__cxx11::string::_M_append((char *)local_258,local_1a8._0_8_);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_DIRECTORY","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,(string *)local_258)
  ;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,"/",
                 &local_278);
  std::__cxx11::string::_M_append((char *)&local_1e8,local_1a8._0_8_);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_OUTPUT_FILE_NAME","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_278);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_1e8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  if (compInstDirName->_M_string_length != 0) {
    local_218.first._M_str = local_190;
    local_1a8._0_8_ = (pointer)0x0;
    local_1a8._8_8_ = 1;
    local_190[0] = '/';
    local_218.first._M_len = (size_t)&DAT_00000001;
    local_218.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1f8 = (compInstDirName->_M_dataplus)._M_p;
    local_1f0 = 0;
    views._M_len = 2;
    views._M_array = &local_218;
    local_200 = compInstDirName->_M_string_length;
    local_1a8._16_8_ = local_218.first._M_str;
    cmCatViews(&local_1c8,views);
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH","");
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_1c8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar5 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackDeb.cmake");
  if (bVar5) {
    bVar5 = createDebPackages(this);
    uVar8 = (uint)bVar5;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error while execution CPackDeb.cmake",0x24);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    sVar4 = local_218.first._M_len;
    sVar7 = strlen((char *)local_218.first._M_len);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x28c,(char *)sVar4,sVar7);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_218.first._M_len
        != &local_218.second) {
      operator_delete((void *)local_218.first._M_len,
                      (ulong)((long)&((local_218.second)->_M_dataplus)._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  return uVar8;
}

Assistant:

int cmCPackDebGenerator::PackageComponentsAllInOne(
  const std::string& compInstDirName)
{
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  this->packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                  << std::endl);

  // The ALL GROUPS in ONE package case
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(
    cmSystemTools::GetParentDirectory(this->toplevel));
  std::string outputFileName(*this->GetOption("CPACK_PACKAGE_FILE_NAME") +
                             this->GetOutputExtension());
  // all GROUP in one vs all COMPONENT in one
  // if must be here otherwise non component paths have a trailing / while
  // components don't
  if (!compInstDirName.empty()) {
    localToplevel += "/" + compInstDirName;
  }

  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel);
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName);
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME", packageFileName);

  if (!compInstDirName.empty()) {
    // Tell CPackDeb.cmake the path where the component is.
    std::string component_path = cmStrCat('/', compInstDirName);
    this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH", component_path);
  }
  if (!this->ReadListFile("Internal/CPack/CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackDeb.cmake" << std::endl);
    return 0;
  }

  return this->createDebPackages();
}